

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase59::~TestCase59(TestCase59 *this)

{
  TestCase59 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(SchemaLoader, LoadLateUnion) {
  SchemaLoader loader;

  StructSchema schema =
      loader.load(Schema::from<test::TestLateUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::TheUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::AnotherUnion>().getProto()).asStruct();

  EXPECT_EQ(6,
      schema.getDependency(schema.getFieldByName("theUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("grault").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(9,
      schema.getDependency(schema.getFieldByName("anotherUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("corge").getProto().getOrdinal().getExplicit());
  EXPECT_TRUE(schema.findFieldByName("corge") == nullptr);
  EXPECT_TRUE(schema.findFieldByName("grault") == nullptr);
}